

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark-udp-pummel.c
# Opt level: O1

void timeout_cb(uv_timer_t *timer)

{
  uv_handle_t *puVar1;
  long lVar2;
  
  exiting = 1;
  if (0 < n_senders_) {
    puVar1 = (uv_handle_t *)&senders[0].udp_handle;
    lVar2 = 0;
    do {
      uv_close(puVar1,close_cb);
      lVar2 = lVar2 + 1;
      puVar1 = (uv_handle_t *)((long)&puVar1[5].u + 0x18);
    } while (lVar2 < n_senders_);
  }
  if (0 < n_receivers_) {
    puVar1 = (uv_handle_t *)&receivers[0].udp_handle;
    lVar2 = 0;
    do {
      uv_close(puVar1,close_cb);
      lVar2 = lVar2 + 1;
      puVar1 = (uv_handle_t *)(puVar1[2].handle_queue + 1);
    } while (lVar2 < n_receivers_);
  }
  return;
}

Assistant:

static void timeout_cb(uv_timer_t* timer) {
  int i;

  exiting = 1;

  for (i = 0; i < n_senders_; i++)
    uv_close((uv_handle_t*)&senders[i].udp_handle, close_cb);

  for (i = 0; i < n_receivers_; i++)
    uv_close((uv_handle_t*)&receivers[i].udp_handle, close_cb);
}